

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O1

void QGraphicsRotation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined8 *puVar2;
  QVector3D *axis;
  undefined8 uVar3;
  undefined4 uVar4;
  
  switch(_c) {
  case InvokeMetaMethod:
    if ((uint)_id < 3) {
      QMetaObject::activate(_o,&staticMetaObject,_id,(void **)0x0);
    }
    if (_c == ReadProperty) goto switchD_0063a963_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) {
        return;
      }
      goto switchD_0063a963_caseD_5;
    }
    break;
  case ReadProperty:
switchD_0063a963_caseD_1:
    puVar2 = (undefined8 *)*_a;
    if (_id == 2) {
      uVar3 = *(undefined8 *)(*(long *)(_o + 8) + 0x98);
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0xa0);
LAB_0063aa5c:
      *puVar2 = uVar3;
      *(undefined4 *)(puVar2 + 1) = uVar4;
    }
    else if (_id == 1) {
      *puVar2 = *(undefined8 *)(*(long *)(_o + 8) + 0x90);
    }
    else if (_id == 0) {
      uVar3 = *(undefined8 *)(*(long *)(_o + 8) + 0x80);
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x88);
      goto LAB_0063aa5c;
    }
    if (_c != WriteProperty) {
      return;
    }
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_0063a963_caseD_3;
  case IndexOfMethod:
switchD_0063a963_caseD_5:
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == originChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
    if (((code *)*plVar1 == angleChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      return;
    }
    if (((code *)*plVar1 == axisChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 2;
      return;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) {
        return;
      }
      goto switchD_0063a963_caseD_1;
    }
  }
  axis = (QVector3D *)*_a;
  if (_id == 2) {
    setAxis((QGraphicsRotation *)_o,axis);
    return;
  }
  if (_id == 1) {
    setAngle((QGraphicsRotation *)_o,*(qreal *)axis->v);
    return;
  }
  if (_id == 0) {
    setOrigin((QGraphicsRotation *)_o,axis);
    return;
  }
switchD_0063a963_caseD_3:
  return;
}

Assistant:

void QGraphicsRotation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsRotation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->originChanged(); break;
        case 1: _t->angleChanged(); break;
        case 2: _t->axisChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::originChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::angleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::axisChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVector3D*>(_v) = _t->origin(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->angle(); break;
        case 2: *reinterpret_cast<QVector3D*>(_v) = _t->axis(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrigin(*reinterpret_cast<QVector3D*>(_v)); break;
        case 1: _t->setAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setAxis(*reinterpret_cast<QVector3D*>(_v)); break;
        default: break;
        }
    }
}